

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnumValue
          (DescriptorBuilder *this,EnumValueDescriptorProto *proto,EnumDescriptor *parent,
          EnumValueDescriptor *result,FlatAllocator *alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  void *pvVar3;
  string *psVar4;
  pointer pcVar5;
  size_type sVar6;
  Descriptor *parent_00;
  pointer pcVar7;
  size_type sVar8;
  FileDescriptorTables *this_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar9;
  bool bVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined8 *puVar11;
  AlphaNum *symbol;
  SymbolBase *ptr;
  string_view name;
  string_view full_name_00;
  string_view element_name;
  string_view name_00;
  string_view full_name_01;
  string_view option_name;
  string_view name_01;
  string full_name;
  EnumValueDescriptor *result_local;
  string outer_scope;
  EnumDescriptor *parent_local;
  string_view local_f0;
  EnumDescriptor **local_e0;
  VoidPtr local_c0;
  code *pcStack_b8;
  undefined1 local_b0 [24];
  char acStack_98 [24];
  AlphaNum local_80;
  string local_50;
  
  paVar1 = &full_name.field_2;
  full_name._M_string_length = 0;
  full_name.field_2._M_local_buf[0] = '\0';
  full_name._M_dataplus._M_p = (pointer)paVar1;
  result_local = result;
  parent_local = parent;
  std::__cxx11::string::reserve((ulong)&full_name);
  pcVar2 = (parent->all_names_).payload_;
  std::__cxx11::string::append((char *)&full_name,(ulong)(pcVar2 + ~(ulong)*(ushort *)(pcVar2 + 2)))
  ;
  std::__cxx11::string::append((string *)&full_name);
  pvVar3 = (proto->field_0)._impl_.name_.tagged_ptr_.ptr_;
  this_01 = protobuf::(anonymous_namespace)::
            FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
            ::AllocateArray<std::__cxx11::string>
                      ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                        *)alloc,2);
  std::__cxx11::string::string((string *)&local_f0,(string *)((ulong)pvVar3 & 0xfffffffffffffffc));
  std::__cxx11::string::operator=((string *)this_01,(string *)&local_f0);
  local_b0._0_8_ = local_b0 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)full_name._M_dataplus._M_p == paVar1) {
    acStack_98[0] = full_name.field_2._8_1_;
    acStack_98[1] = full_name.field_2._9_1_;
    acStack_98[2] = full_name.field_2._10_1_;
    acStack_98[3] = full_name.field_2._11_1_;
    acStack_98[4] = full_name.field_2._12_1_;
    acStack_98[5] = full_name.field_2._13_1_;
    acStack_98[6] = full_name.field_2._14_1_;
    acStack_98[7] = full_name.field_2._15_1_;
  }
  else {
    local_b0._0_8_ = full_name._M_dataplus._M_p;
  }
  local_b0._17_7_ = full_name.field_2._M_allocated_capacity._1_7_;
  local_b0[0x10] = full_name.field_2._M_local_buf[0];
  local_b0._8_8_ = full_name._M_string_length;
  full_name._M_string_length = 0;
  full_name.field_2._M_local_buf[0] = '\0';
  full_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::operator=((string *)(this_01 + 1),(string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)&local_f0);
  result->all_names_ = this_01;
  result->number_ = (proto->field_0)._impl_.number_;
  result->type_ = parent;
  puVar11 = (undefined8 *)
            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  name._M_str = (char *)*puVar11;
  name._M_len = puVar11[1];
  full_name_01._M_str = this_01[1]._M_dataplus._M_p;
  full_name_01._M_len = this_01[1]._M_string_length;
  ValidateSymbolName(this,name,full_name_01,&proto->super_Message);
  option_name._M_str = "google.protobuf.EnumValueOptions";
  option_name._M_len = 0x20;
  AllocateOptions<google::protobuf::EnumValueDescriptor>(this,proto,result,3,option_name,alloc);
  psVar4 = result->all_names_;
  pcVar5 = psVar4[1]._M_dataplus._M_p;
  sVar6 = psVar4[1]._M_string_length;
  parent_00 = parent->containing_type_;
  pcVar7 = (psVar4->_M_dataplus)._M_p;
  sVar8 = psVar4->_M_string_length;
  (result->super_SymbolBaseN<0>).super_SymbolBase.symbol_type_ = '\x05';
  full_name_00._M_str = pcVar5;
  full_name_00._M_len = sVar6;
  name_01._M_str = pcVar7;
  name_01._M_len = sVar8;
  bVar9 = AddSymbol(this,full_name_00,parent_00,name_01,&proto->super_Message,(Symbol)result);
  this_00 = this->file_tables_;
  pcVar5 = (result->all_names_->_M_dataplus)._M_p;
  sVar6 = result->all_names_->_M_string_length;
  symbol = (AlphaNum *)&result->super_SymbolBaseN<1>;
  (result->super_SymbolBaseN<1>).super_SymbolBase.symbol_type_ = '\x06';
  name_00._M_str = pcVar5;
  name_00._M_len = sVar6;
  bVar10 = FileDescriptorTables::AddAliasUnderParent(this_00,parent,name_00,(Symbol)symbol);
  if (!bVar9 && bVar10) {
    outer_scope._M_dataplus._M_p = (pointer)&outer_scope.field_2;
    outer_scope._M_string_length = 0;
    outer_scope.field_2._M_local_buf[0] = '\0';
    if (parent->containing_type_ == (Descriptor *)0x0) {
      psVar4 = this->file_->package_;
      local_b0._8_8_ = (psVar4->_M_dataplus)._M_p;
      local_b0._0_8_ = psVar4->_M_string_length;
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_f0,(basic_string_view<char,_std::char_traits<char>_> *)local_b0,
                 (allocator<char> *)&local_80);
    }
    else {
      local_b0._8_8_ = (parent->containing_type_->all_names_).payload_;
      local_b0._0_8_ = ZEXT28(*(ushort *)(local_b0._8_8_ + 2));
      local_b0._8_8_ = local_b0._8_8_ + ~local_b0._0_8_;
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_f0,(basic_string_view<char,_std::char_traits<char>_> *)local_b0,
                 (allocator<char> *)&local_80);
    }
    std::__cxx11::string::operator=((string *)&outer_scope,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    if (outer_scope._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&outer_scope);
    }
    else {
      local_f0 = absl::lts_20250127::NullSafeStringView("\"");
      local_b0._0_8_ = outer_scope._M_string_length;
      local_b0._8_8_ = outer_scope._M_dataplus._M_p;
      local_80.piece_ = absl::lts_20250127::NullSafeStringView("\"");
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_50,(lts_20250127 *)&local_f0,(AlphaNum *)local_b0,&local_80,symbol);
      std::__cxx11::string::operator=((string *)&outer_scope,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    local_f0._M_str = (char *)&outer_scope;
    local_f0._M_len = (size_t)&result_local;
    local_e0 = &parent_local;
    pcStack_b8 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildEnumValue(google::protobuf::EnumValueDescriptorProto_const&,google::protobuf::EnumDescriptor_const*,google::protobuf::EnumValueDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
    ;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::BuildEnumValue(google::protobuf::EnumValueDescriptorProto_const&,google::protobuf::EnumDescriptor_const*,google::protobuf::EnumValueDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
    ;
    make_error.ptr_.fun = (_func_void *)&local_f0;
    element_name._M_str = result->all_names_[1]._M_dataplus._M_p;
    element_name._M_len = result->all_names_[1]._M_string_length;
    local_c0.obj = &local_f0;
    AddError(this,element_name,&proto->super_Message,NAME,make_error);
    std::__cxx11::string::~string((string *)&outer_scope);
    result = result_local;
  }
  FileDescriptorTables::AddEnumValueByNumber(this->file_tables_,result);
  std::__cxx11::string::~string((string *)&full_name);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnumValue(const EnumValueDescriptorProto& proto,
                                       const EnumDescriptor* parent,
                                       EnumValueDescriptor* result,
                                       internal::FlatAllocator& alloc) {
  // Note:  full_name for enum values is a sibling to the parent's name, not a
  //   child of it.
  std::string full_name;
  size_t scope_len = parent->full_name().size() - parent->name().size();
  full_name.reserve(scope_len + proto.name().size());
  full_name.append(parent->full_name().data(), scope_len);
  full_name.append(proto.name());

  result->all_names_ =
      alloc.AllocateStrings(proto.name(), std::move(full_name));
  result->number_ = proto.number();
  result->type_ = parent;

  ValidateSymbolName(proto.name(), result->full_name(), proto);

  // Copy options.
  AllocateOptions(proto, result, EnumValueDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.EnumValueOptions", alloc);

  // Again, enum values are weird because we makes them appear as siblings
  // of the enum type instead of children of it.  So, we use
  // parent->containing_type() as the value's parent.
  bool added_to_outer_scope =
      AddSymbol(result->full_name(), parent->containing_type(), result->name(),
                proto, Symbol::EnumValue(result, 0));

  // However, we also want to be able to search for values within a single
  // enum type, so we add it as a child of the enum type itself, too.
  // Note:  This could fail, but if it does, the error has already been
  //   reported by the above AddSymbol() call, so we ignore the return code.
  bool added_to_inner_scope = file_tables_->AddAliasUnderParent(
      parent, result->name(), Symbol::EnumValue(result, 1));

  if (added_to_inner_scope && !added_to_outer_scope) {
    // This value did not conflict with any values defined in the same enum,
    // but it did conflict with some other symbol defined in the enum type's
    // scope.  Let's print an additional error to explain this.
    std::string outer_scope;
    if (parent->containing_type() == nullptr) {
      outer_scope = std::string(file_->package());
    } else {
      outer_scope = std::string(parent->containing_type()->full_name());
    }

    if (outer_scope.empty()) {
      outer_scope = "the global scope";
    } else {
      outer_scope = absl::StrCat("\"", outer_scope, "\"");
    }

    AddError(
        result->full_name(), proto, DescriptorPool::ErrorCollector::NAME, [&] {
          return absl::StrCat(
              "Note that enum values use C++ scoping rules, meaning that "
              "enum values are siblings of their type, not children of it.  "
              "Therefore, \"",
              result->name(), "\" must be unique within ", outer_scope,
              ", not just within \"", parent->name(), "\".");
        });
  }

  // An enum is allowed to define two numbers that refer to the same value.
  // FindValueByNumber() should return the first such value, so we simply
  // ignore AddEnumValueByNumber()'s return code.
  file_tables_->AddEnumValueByNumber(result);
}